

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_pkey.c
# Opt level: O0

OSSL_ENCODER_CTX *
OSSL_ENCODER_CTX_new_for_pkey
          (EVP_PKEY *pkey,int selection,char *output_type,char *output_struct,char *propquery)

{
  int iVar1;
  OSSL_ENCODER_CTX *ctx_00;
  OSSL_PROVIDER *prov_00;
  long in_RCX;
  long in_RDI;
  char *in_R8;
  BIO *trc_out_1;
  int save_parameters;
  OSSL_PARAM params [2];
  BIO *trc_out;
  OSSL_PROVIDER *prov;
  OSSL_LIB_CTX *libctx;
  OSSL_ENCODER_CTX *ctx;
  OSSL_ENCODER_CTX *in_stack_ffffffffffffff18;
  int *buf;
  char *in_stack_ffffffffffffff20;
  undefined1 local_d8 [4];
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  OSSL_PARAM *in_stack_ffffffffffffff40;
  OSSL_ENCODER_CTX *in_stack_ffffffffffffff48;
  int local_a8 [6];
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  EVP_PKEY *in_stack_ffffffffffffff80;
  OSSL_ENCODER_CTX *in_stack_ffffffffffffff88;
  OSSL_LIB_CTX *local_40;
  
  local_40 = (OSSL_LIB_CTX *)0x0;
  if (in_RDI == 0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
    ERR_set_error(0x3b,0xc0102,(char *)0x0);
    return (OSSL_ENCODER_CTX *)0x0;
  }
  if ((*(long *)(in_RDI + 0x20) == 0) && (*(long *)(in_RDI + 0x68) == 0)) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
    ERR_set_error(0x3b,0x80106,"The passed EVP_PKEY must be assigned a key");
    return (OSSL_ENCODER_CTX *)0x0;
  }
  ctx_00 = OSSL_ENCODER_CTX_new();
  if (ctx_00 == (OSSL_ENCODER_CTX *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
    ERR_set_error(0x3b,0xc0100,(char *)0x0);
    return (OSSL_ENCODER_CTX *)0x0;
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    prov_00 = EVP_KEYMGMT_get0_provider(*(EVP_KEYMGMT **)(in_RDI + 0x60));
    local_40 = ossl_provider_libctx(prov_00);
  }
  iVar1 = OSSL_ENCODER_CTX_set_output_type(in_stack_ffffffffffffff18,(char *)0x40fa5e);
  if (((iVar1 != 0) &&
      (((in_RCX == 0 ||
        (iVar1 = OSSL_ENCODER_CTX_set_output_structure(in_stack_ffffffffffffff18,(char *)0x40fa87),
        iVar1 != 0)) &&
       (iVar1 = OSSL_ENCODER_CTX_set_selection(in_stack_ffffffffffffff18,0), iVar1 != 0)))) &&
     ((iVar1 = ossl_encoder_ctx_setup_for_pkey
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70), iVar1 != 0 &&
      (iVar1 = OSSL_ENCODER_CTX_add_extra(ctx_00,local_40,in_R8), iVar1 != 0)))) {
    memset(local_a8,0,0x50);
    buf = local_a8;
    OSSL_PARAM_construct_int(in_stack_ffffffffffffff20,buf);
    memcpy(buf,local_d8,0x28);
    OSSL_ENCODER_CTX_set_params(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    return ctx_00;
  }
  OSSL_ENCODER_CTX_free((OSSL_ENCODER_CTX *)0x40fb88);
  return (OSSL_ENCODER_CTX *)0x0;
}

Assistant:

OSSL_ENCODER_CTX *OSSL_ENCODER_CTX_new_for_pkey(const EVP_PKEY *pkey,
                                                int selection,
                                                const char *output_type,
                                                const char *output_struct,
                                                const char *propquery)
{
    OSSL_ENCODER_CTX *ctx = NULL;
    OSSL_LIB_CTX *libctx = NULL;

    if (pkey == NULL) {
        ERR_raise(ERR_LIB_OSSL_ENCODER, ERR_R_PASSED_NULL_PARAMETER);
        return NULL;
    }

    if (!evp_pkey_is_assigned(pkey)) {
        ERR_raise_data(ERR_LIB_OSSL_ENCODER, ERR_R_PASSED_INVALID_ARGUMENT,
                       "The passed EVP_PKEY must be assigned a key");
        return NULL;
    }

    if ((ctx = OSSL_ENCODER_CTX_new()) == NULL) {
        ERR_raise(ERR_LIB_OSSL_ENCODER, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    if (evp_pkey_is_provided(pkey)) {
        const OSSL_PROVIDER *prov = EVP_KEYMGMT_get0_provider(pkey->keymgmt);

        libctx = ossl_provider_libctx(prov);
    }

    OSSL_TRACE_BEGIN(ENCODER) {
        BIO_printf(trc_out,
                   "(ctx %p) Looking for %s encoders with selection %d\n",
                   (void *)ctx, EVP_PKEY_get0_type_name(pkey), selection);
        BIO_printf(trc_out, "    output type: %s, output structure: %s\n",
                   output_type, output_struct);
    } OSSL_TRACE_END(ENCODER);

    if (OSSL_ENCODER_CTX_set_output_type(ctx, output_type)
        && (output_struct == NULL
            || OSSL_ENCODER_CTX_set_output_structure(ctx, output_struct))
        && OSSL_ENCODER_CTX_set_selection(ctx, selection)
        && ossl_encoder_ctx_setup_for_pkey(ctx, pkey, selection, propquery)
        && OSSL_ENCODER_CTX_add_extra(ctx, libctx, propquery)) {
        OSSL_PARAM params[2] = { OSSL_PARAM_END, OSSL_PARAM_END };
        int save_parameters = pkey->save_parameters;

        params[0] = OSSL_PARAM_construct_int(OSSL_ENCODER_PARAM_SAVE_PARAMETERS,
                                             &save_parameters);
        /* ignoring error as this is only auxiliary parameter */
        (void)OSSL_ENCODER_CTX_set_params(ctx, params);

        OSSL_TRACE_BEGIN(ENCODER) {
            BIO_printf(trc_out, "(ctx %p) Got %d encoders\n",
                       (void *)ctx, OSSL_ENCODER_CTX_get_num_encoders(ctx));
        } OSSL_TRACE_END(ENCODER);
        return ctx;
    }

    OSSL_ENCODER_CTX_free(ctx);
    return NULL;
}